

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

string * __thiscall
PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement_abi_cxx11_
          (string *__return_storage_ptr__,PlanningUnitMADPDiscrete *this,Index agentI,Index dI,
          PolicyDomainCategory cat)

{
  ActionObservationHistoryTree *this_00;
  ActionObservationHistory *this_01;
  E *this_02;
  string *s;
  
  if (cat == OHIST_INDEX) {
    SoftPrintObservationHistory_abi_cxx11_(__return_storage_ptr__,this,agentI,dI);
  }
  else {
    if (cat != AOHIST_INDEX) {
      if (cat == TYPE_INDEX) {
        this_02 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_02,
             "SoftPrintPolicyDomain: types are not a valid policy domain for a PlanningUnitMADPDiscrete"
            );
      }
      else {
        this_02 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_02,
             "SoftPrintPolicyDomain: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"
            );
      }
      __cxa_throw(this_02,&E::typeinfo,E::~E);
    }
    this_00 = GetActionObservationHistoryTree(this,agentI,dI);
    this_01 = ActionObservationHistoryTree::GetActionObservationHistory(this_00);
    ActionObservationHistory::SoftPrint_abi_cxx11_(__return_storage_ptr__,this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

string PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement(
    Index agentI, Index dI, PolicyGlobals::PolicyDomainCategory cat ) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        {
            string s = SoftPrintObservationHistory(agentI, dI);
            return s;


            break;
        }
    case PolicyGlobals::AOHIST_INDEX :
        return GetActionObservationHistoryTree(agentI,dI)->
            GetActionObservationHistory()->SoftPrint();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("SoftPrintPolicyDomain: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("SoftPrintPolicyDomain: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
    return("IMPOSSIBLE!");
}